

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cc
# Opt level: O1

void __thiscall
Vector::erase(Vector *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *ptr,size_t idx)

{
  ulong uVar1;
  
  uVar1 = (**(code **)(*(long *)this + 200))();
  if (idx + 1 < uVar1) {
    copy(this,(EVP_PKEY_CTX *)ptr,(EVP_PKEY_CTX *)idx);
  }
  resize(this,ptr,uVar1 - 1);
  return;
}

Assistant:

void Vector::erase(std::vector<uint8_t>* ptr, size_t idx) const
{
    // Copy the remaining elements to the right place
    size_t element_count = getElementCount(ptr);
    if (element_count > idx + 1)
        copy(ptr, idx, ptr, idx + 1, element_count - idx - 1);

    // Then shrink the vector
    resize(ptr, element_count - 1);
}